

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_blurshader.cpp
# Opt level: O0

void __thiscall
FBlurShader::ComputeBlurSamples
          (FBlurShader *this,int sampleCount,float blurAmount,TArray<float,_float> *sampleWeights,
          TArray<int,_int> *sampleOffsets)

{
  float *pfVar1;
  int *piVar2;
  float fVar3;
  undefined4 local_38;
  int i_1;
  float weight;
  int i;
  float totalWeights;
  TArray<int,_int> *sampleOffsets_local;
  TArray<float,_float> *sampleWeights_local;
  float blurAmount_local;
  int sampleCount_local;
  FBlurShader *this_local;
  
  TArray<float,_float>::Resize(sampleWeights,sampleCount);
  TArray<int,_int>::Resize(sampleOffsets,sampleCount);
  fVar3 = ComputeGaussian(this,0.0,blurAmount);
  pfVar1 = TArray<float,_float>::operator[](sampleWeights,0);
  *pfVar1 = fVar3;
  piVar2 = TArray<int,_int>::operator[](sampleOffsets,0);
  *piVar2 = 0;
  pfVar1 = TArray<float,_float>::operator[](sampleWeights,0);
  weight = *pfVar1;
  for (i_1 = 0; i_1 < sampleCount / 2; i_1 = i_1 + 1) {
    fVar3 = ComputeGaussian(this,(float)i_1 + 1.0,blurAmount);
    pfVar1 = TArray<float,_float>::operator[](sampleWeights,(long)(i_1 * 2 + 1));
    *pfVar1 = fVar3;
    pfVar1 = TArray<float,_float>::operator[](sampleWeights,(long)(i_1 * 2 + 2));
    *pfVar1 = fVar3;
    piVar2 = TArray<int,_int>::operator[](sampleOffsets,(long)(i_1 * 2 + 1));
    *piVar2 = i_1 + 1;
    piVar2 = TArray<int,_int>::operator[](sampleOffsets,(long)(i_1 * 2 + 2));
    *piVar2 = -1 - i_1;
    weight = fVar3 * 2.0 + weight;
  }
  for (local_38 = 0; local_38 < sampleCount; local_38 = local_38 + 1) {
    pfVar1 = TArray<float,_float>::operator[](sampleWeights,(long)local_38);
    *pfVar1 = *pfVar1 / weight;
  }
  return;
}

Assistant:

void FBlurShader::ComputeBlurSamples(int sampleCount, float blurAmount, TArray<float> &sampleWeights, TArray<int> &sampleOffsets)
{
	sampleWeights.Resize(sampleCount);
	sampleOffsets.Resize(sampleCount);

	sampleWeights[0] = ComputeGaussian(0, blurAmount);
	sampleOffsets[0] = 0;

	float totalWeights = sampleWeights[0];

	for (int i = 0; i < sampleCount / 2; i++)
	{
		float weight = ComputeGaussian(i + 1.0f, blurAmount);

		sampleWeights[i * 2 + 1] = weight;
		sampleWeights[i * 2 + 2] = weight;
		sampleOffsets[i * 2 + 1] = i + 1;
		sampleOffsets[i * 2 + 2] = -i - 1;

		totalWeights += weight * 2;
	}

	for (int i = 0; i < sampleCount; i++)
	{
		sampleWeights[i] /= totalWeights;
	}
}